

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::
Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
::Action(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
         *this,ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
               *impl)

{
  ActionAdapter local_28;
  ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *local_18;
  ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *impl_local;
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>>
  ::
  shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>,void>
            ((shared_ptr<testing::ActionInterface<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>>
              *)&local_28,impl);
  std::
  function<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>
  ::
  function<testing::Action<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>::ActionAdapter,void>
            ((function<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>
              *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}